

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtok.c
# Opt level: O2

ssize_t mpt_memtok(iovec *data,size_t ndat,char *tok,char *com,char *escape)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  size_t __n;
  size_t *psVar4;
  void *pvVar5;
  ushort **ppuVar6;
  ulong uVar7;
  int *piVar8;
  size_t sVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  bool bVar19;
  ssize_t sStack_80;
  size_t *local_60;
  size_t local_58;
  size_t local_50;
  
  sStack_80 = -1;
  if (data == (iovec *)0x0) {
    iVar11 = 0xe;
LAB_00113e85:
    piVar8 = __errno_location();
    *piVar8 = iVar11;
    return sStack_80;
  }
  if (tok == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(tok);
  }
  if (com == (char *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = strlen(com);
  }
  if (escape == (char *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = strlen(escape);
  }
  local_60 = &data->iov_len;
  uVar12 = 0x20;
  uVar16 = 0;
  sVar9 = 0;
  uVar14 = 0;
  pbVar17 = (byte *)0x0;
  bVar2 = 0;
LAB_00113cec:
  psVar4 = local_60 + uVar16 * 2;
  uVar7 = uVar14 + 1;
  do {
    uVar14 = uVar7;
    uVar15 = sVar9;
    if (uVar7 < sVar9) break;
    if (ndat <= uVar16) goto LAB_00113e7e;
    pbVar17 = (byte *)((iovec *)(psVar4 + -1))->iov_base;
    uVar15 = *psVar4;
    uVar16 = uVar16 + 1;
    psVar4 = psVar4 + 2;
    sVar9 = 0;
    uVar14 = 0;
    uVar7 = 1;
  } while (uVar15 == 0);
  sVar9 = uVar15;
  if (local_58 == 0) {
LAB_00113d69:
    if (((local_50 != 0) && (pvVar5 = memchr(com,(uint)*pbVar17,local_50), pvVar5 != (void *)0x0))
       && (ppuVar6 = __ctype_b_loc(),
          (*(byte *)((long)*ppuVar6 + (ulong)uVar12 * 2 + 1) & 0x20) != 0)) {
      if (tok == (char *)0x0) {
        do {
          uVar7 = uVar14;
          if (uVar14 < sVar9) {
            uVar7 = sVar9;
          }
          uVar15 = uVar14;
          pbVar18 = pbVar17;
          do {
            pbVar17 = pbVar18;
            uVar14 = uVar7 + 1;
            if (sVar9 <= uVar15) break;
            uVar14 = uVar15 + 1;
            pbVar17 = pbVar18 + 1;
            pbVar1 = pbVar18 + 1;
            uVar15 = uVar14;
            pbVar18 = pbVar17;
          } while (*pbVar1 != 10);
          if (uVar14 <= sVar9) goto LAB_00113d9e;
          if (ndat <= uVar16) goto LAB_00113e7e;
          pbVar17 = (byte *)data[uVar16].iov_base;
          sVar9 = data[uVar16].iov_len;
          uVar16 = uVar16 + 1;
          uVar14 = 0;
        } while( true );
      }
LAB_00113ea1:
      iVar11 = 0xb;
      sStack_80 = -2;
      if (bVar2 == 0) {
        iVar11 = 0x4b;
        do {
          uVar16 = uVar16 - 1;
          if (uVar16 == 0) {
            return uVar14;
          }
          uVar14 = uVar14 + *local_60;
          local_60 = local_60 + 2;
        } while (-1 < (long)uVar14);
        sStack_80 = -1;
      }
      goto LAB_00113e85;
    }
LAB_00113d9e:
    if (tok == (char *)0x0) {
      ppuVar6 = __ctype_b_loc();
      bVar10 = *pbVar17;
      if ((*(byte *)((long)*ppuVar6 + (ulong)bVar10 * 2 + 1) & 0x20) == 0) goto LAB_00113ea1;
    }
    else {
      bVar10 = *pbVar17;
      if ((__n != 0) && (pvVar5 = memchr(tok,(uint)bVar10,__n), pvVar5 != (void *)0x0))
      goto LAB_00113ea1;
    }
    uVar12 = (uint)bVar10;
    bVar10 = bVar2;
  }
  else {
    bVar10 = *pbVar17;
    uVar13 = (uint)bVar10;
    if (bVar2 == 0) {
      pvVar5 = memchr(escape,(uint)bVar10,local_58);
      if (pvVar5 == (void *)0x0) goto LAB_00113d69;
    }
    else {
      bVar3 = bVar2;
      if (uVar12 != 0x5c) {
        bVar3 = 0;
      }
      bVar19 = bVar2 == bVar10;
      uVar12 = uVar13;
      bVar10 = bVar2;
      if (bVar19) {
        bVar10 = bVar3;
      }
    }
  }
  pbVar17 = pbVar17 + 1;
  bVar2 = bVar10;
  goto LAB_00113cec;
LAB_00113e7e:
  iVar11 = 0xb;
  sStack_80 = -2;
  goto LAB_00113e85;
}

Assistant:

extern ssize_t mpt_memtok(const struct iovec *data, size_t ndat, const char *tok, const char *com, const char *escape)
{
	unsigned char	*curr = NULL;
	size_t	i = 0, len = 0, pos = 0, tlen, clen, elen;
	int	match = 0, prev = ' ';
	
	if ( data == NULL ) {
		errno = EFAULT; return -1;
	}
	
	tlen = tok ? strlen(tok) : 0;
	clen = com ? strlen(com) : 0;
	elen = escape ? strlen(escape) : 0;
	
	while ( 1 ) {
		/* continue in next data part */
		if ( ++pos >= len ) {
			if ( i >= ndat ) {
				errno = EAGAIN; return -2;
			}
			pos  = 0;
			curr = data[i].iov_base;
			if ( !(len = data[i++].iov_len ) )
				continue;
		}
		/* check for escape character */
		if ( elen ) {
			if ( match ) {
				/* unset if current is valid end */
				if ( *curr == match && prev != '\\' )
					match = 0;
				prev = *(curr++);
				continue;
			}
			/* mark if current is in delimiters */
			else if ( memchr(escape, *curr, elen) ) {
				match = *(curr++);
				continue;
			}
		}
		/* charater is in comments */
		if ( clen && memchr(com, *curr, clen) && isspace(prev) ) {
			if ( tok )
				break;
			/* continue until end of line */
			do {
				while ( pos++ < len && *(++curr) != '\n' );
				
				if ( pos <= len )
					break;
				else if ( i >= ndat ) {
					errno = EAGAIN; return -2;
				}
				pos  = 0;
				curr = data[i].iov_base;
				len  = data[i++].iov_len;
				
			} while ( 1 );
		}
		/* token is found */
		if ( tok ) {
			if ( tlen && memchr(tok, *curr, tlen) )
				break;
		}
		/* finding visible character succeeded */
		else if ( !isspace(*curr) )
			break;
		
		prev = *(curr++);
	}
	
	i--;
	
	/* escaped sequence unfinished */
	if ( match ) {
		errno = EAGAIN; return -2;
	}
	for ( elen = 0 ; elen < i ; elen ++ ) {
		/* offset is to big for return value */
		if ( (pos += data[elen].iov_len) > SSIZE_MAX ) {
			errno = EOVERFLOW; return -1;
		}
	}
	
	return pos;
}